

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Integer_combination_iterator.h
# Opt level: O0

void __thiscall
Gudhi::coxeter_triangulation::Integer_combination_iterator::
Integer_combination_iterator<Gudhi::coxeter_triangulation::Size_range<std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>
          (Integer_combination_iterator *this,uint *n,uint *k,
          Size_range<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
          *bounds)

{
  uint uVar1;
  value_type vVar2;
  Size_range<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  *this_00;
  type_conflict tVar3;
  reference puVar4;
  reference pvVar5;
  bool local_c9;
  uint local_a4;
  uint local_a0;
  uint s;
  uint i;
  value_type_conflict2 local_94;
  unsigned_long local_90;
  unsigned_long b;
  iterator __end0;
  iterator __begin0;
  Size_range<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  *__range3;
  uint sum_radices;
  allocator<unsigned_int> local_29;
  Size_range<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  *local_28;
  Size_range<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  *bounds_local;
  uint *k_local;
  uint *n_local;
  Integer_combination_iterator *this_local;
  
  uVar1 = *k;
  local_28 = bounds;
  bounds_local = (Size_range<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                  *)k;
  k_local = n;
  n_local = (uint *)this;
  std::allocator<unsigned_int>::allocator(&local_29);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&this->value_,(ulong)(uVar1 + 2),&local_29);
  std::allocator<unsigned_int>::~allocator(&local_29);
  local_c9 = true;
  if (*k_local != 0) {
    local_c9 = *(int *)&bounds_local->t_ == 0;
  }
  this->is_end_ = local_c9;
  this->k_ = *(uint *)&bounds_local->t_;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->bounds_);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            (&this->bounds_,(ulong)(*(int *)&bounds_local->t_ + 2));
  this_00 = local_28;
  __range3._0_4_ = 0;
  Size_range<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ::begin((iterator *)&__end0.value_,local_28);
  Size_range<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ::end((iterator *)&b,this_00);
  while( true ) {
    tVar3 = boost::iterators::operator!=
                      ((iterator_facade<Gudhi::coxeter_triangulation::Size_iterator<__gnu_cxx::__normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_const_unsigned_long,_boost::iterators::forward_traversal_tag,_const_unsigned_long_&,_long>
                        *)&__end0.value_,
                       (iterator_facade<Gudhi::coxeter_triangulation::Size_iterator<__gnu_cxx::__normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_const_unsigned_long,_boost::iterators::forward_traversal_tag,_const_unsigned_long_&,_long>
                        *)&b);
    if (!tVar3) break;
    puVar4 = boost::iterators::detail::
             iterator_facade_base<Gudhi::coxeter_triangulation::Size_iterator<__gnu_cxx::__normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_const_unsigned_long,_boost::iterators::forward_traversal_tag,_const_unsigned_long_&,_long,_false,_false>
             ::operator*((iterator_facade_base<Gudhi::coxeter_triangulation::Size_iterator<__gnu_cxx::__normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_const_unsigned_long,_boost::iterators::forward_traversal_tag,_const_unsigned_long_&,_long,_false,_false>
                          *)&__end0.value_);
    local_90 = *puVar4;
    local_94 = (value_type_conflict2)local_90;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&this->bounds_,&local_94);
    __range3._0_4_ = (uint)__range3 + (int)local_90;
    boost::iterators::detail::
    iterator_facade_base<Gudhi::coxeter_triangulation::Size_iterator<__gnu_cxx::__normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_const_unsigned_long,_boost::iterators::forward_traversal_tag,_const_unsigned_long_&,_long,_false,_false>
    ::operator++((iterator_facade_base<Gudhi::coxeter_triangulation::Size_iterator<__gnu_cxx::__normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_const_unsigned_long,_boost::iterators::forward_traversal_tag,_const_unsigned_long_&,_long,_false,_false>
                  *)&__end0.value_);
  }
  i = 2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&this->bounds_,&i);
  s = 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&this->bounds_,&s);
  if ((uint)__range3 < *k_local) {
    this->is_end_ = true;
  }
  else {
    local_a0 = 0;
    local_a4 = *k_local;
    while( true ) {
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->bounds_,(ulong)local_a0);
      if (local_a4 < *pvVar5) break;
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->bounds_,(ulong)local_a0);
      vVar2 = *pvVar5;
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->value_,(ulong)local_a0);
      *pvVar5 = vVar2;
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->bounds_,(ulong)local_a0);
      local_a4 = local_a4 - *pvVar5;
      local_a0 = local_a0 + 1;
    }
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->value_,(ulong)local_a0);
    *pvVar5 = local_a4;
    while (local_a0 = local_a0 + 1, local_a0 < this->k_) {
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->value_,(ulong)local_a0);
      *pvVar5 = 0;
    }
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->value_,(ulong)*(uint *)&bounds_local->t_);
    *pvVar5 = 1;
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->value_,(ulong)(*(int *)&bounds_local->t_ + 1));
    *pvVar5 = 0;
  }
  return;
}

Assistant:

Integer_combination_iterator(const uint& n, const uint& k, const Bound_range& bounds)
	  : value_(k + 2), is_end_(n == 0 || k == 0), k_(k) {
    bounds_.reserve(k + 2);
    uint sum_radices = 0;
    for (auto b : bounds) {
      bounds_.push_back(b);
      sum_radices += b;
    }
    bounds_.push_back(2);
    bounds_.push_back(1);
    if (n > sum_radices) {
      is_end_ = true;
      return;
    }
    uint i = 0;
    uint s = n;
    while (s >= bounds_[i]) {
      value_[i] = bounds_[i];
      s -= bounds_[i];
      i++;
    }
    value_[i++] = s;

    while (i < k_) value_[i++] = 0;
    value_[k] = 1;
    value_[k + 1] = 0;
  }